

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# helpers.cc
# Opt level: O2

string * __thiscall
google::protobuf::compiler::cpp::WeakDescriptorDataSection_abi_cxx11_
          (string *__return_storage_ptr__,cpp *this,string_view prefix,Descriptor *descriptor,
          int index_in_file_messages,Options *options)

{
  char *pcVar1;
  FileDescriptor *d;
  undefined4 in_register_0000008c;
  string_view name;
  string local_110;
  AlphaNum local_f0;
  AlphaNum local_c0;
  AlphaNum local_90;
  string_view local_60 [3];
  
  d = (FileDescriptor *)CONCAT44(in_register_0000008c,index_in_file_messages);
  pcVar1 = *(char **)(prefix._M_str + 0x18);
  local_60[0] = absl::lts_20250127::NullSafeStringView("pb_");
  local_90.piece_._M_len = (size_t)this;
  local_90.piece_._M_str = (char *)prefix._M_len;
  local_c0.piece_ = absl::lts_20250127::NullSafeStringView("_");
  absl::lts_20250127::AlphaNum::AlphaNum(&local_f0,(int)descriptor);
  absl::lts_20250127::StrCat_abi_cxx11_
            (&local_110,(lts_20250127 *)local_60,&local_90,&local_c0,&local_f0,
             (AlphaNum *)CONCAT44(in_register_0000008c,index_in_file_messages));
  name._M_str = pcVar1;
  name._M_len = (size_t)local_110._M_dataplus._M_p;
  UniqueName_abi_cxx11_
            (__return_storage_ptr__,(cpp *)local_110._M_string_length,name,d,
             (Options *)CONCAT44(in_register_0000008c,index_in_file_messages));
  std::__cxx11::string::~string((string *)&local_110);
  return __return_storage_ptr__;
}

Assistant:

std::string WeakDescriptorDataSection(absl::string_view prefix,
                                      const Descriptor* descriptor,
                                      int index_in_file_messages,
                                      const Options& options) {
  const auto* file = descriptor->file();

  // To make a compact name we use the index of the object in its file
  // of its name.
  // So the name could be `pb_def_3_HASH` instead of
  // `pd_def_VeryLongClassName_WithNesting_AndMoreNames_HASH`
  // We need a know common prefix to merge the sections later on.
  return UniqueName(absl::StrCat("pb_", prefix, "_", index_in_file_messages),
                    file, options);
}